

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall perfetto::base::UnixSocketRaw::SetRxTimeout(UnixSocketRaw *this,uint32_t timeout_ms)

{
  int iVar1;
  ulong uStack_28;
  uint32_t timeout_sec;
  timeval timeout;
  uint32_t timeout_ms_local;
  UnixSocketRaw *this_local;
  
  timeout.tv_usec._4_4_ = timeout_ms;
  memset(&stack0xffffffffffffffd8,0,0x10);
  uStack_28 = (ulong)(timeout.tv_usec._4_4_ / 1000);
  timeout.tv_sec = (__time_t)((timeout.tv_usec._4_4_ % 1000) * 1000);
  iVar1 = ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
          ::operator*(&this->fd_);
  iVar1 = setsockopt(iVar1,1,0x14,&stack0xffffffffffffffd8,0x10);
  return iVar1 == 0;
}

Assistant:

bool UnixSocketRaw::SetRxTimeout(uint32_t timeout_ms) {
  PERFETTO_DCHECK(fd_);
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  DWORD timeout = timeout_ms;
#else
  struct timeval timeout {};
  uint32_t timeout_sec = timeout_ms / 1000;
  timeout.tv_sec = static_cast<decltype(timeout.tv_sec)>(timeout_sec);
  timeout.tv_usec = static_cast<decltype(timeout.tv_usec)>(
      (timeout_ms - (timeout_sec * 1000)) * 1000);
#endif
  return setsockopt(*fd_, SOL_SOCKET, SO_RCVTIMEO,
                    reinterpret_cast<const char*>(&timeout),
                    sizeof(timeout)) == 0;
}